

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetItemFromArrayPrototype
               (JavascriptArray *arr,int32 indexInt,Var *result,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  BOOL BVar4;
  uint32 uVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  JavascriptArray *this;
  DynamicObject *this_00;
  ScriptContext *this_01;
  JavascriptLibrary *this_02;
  DynamicObject *pDVar8;
  JavascriptArray *arrayPrototype;
  RecyclableObject *prototype;
  ScriptContext *scriptContext_local;
  Var *result_local;
  int32 indexInt_local;
  JavascriptArray *arr_local;
  TypeId typeId;
  
  pRVar6 = RecyclableObject::GetPrototype((RecyclableObject *)arr);
  if (pRVar6 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  TVar3 = RecyclableObject::GetTypeId(pRVar6);
  if ((0x57 < (int)TVar3) && (BVar4 = RecyclableObject::IsExternal(pRVar6), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (TVar3 == TypeIds_Array) {
    this = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(pRVar6);
    uVar5 = ArrayObject::GetLength(&this->super_ArrayObject);
    if ((uVar5 == 0) ||
       (BVar4 = RecyclableObject::GetItem
                          ((RecyclableObject *)this,this,indexInt,result,scriptContext), BVar4 == 0)
       ) {
      this_00 = (DynamicObject *)RecyclableObject::GetPrototype((RecyclableObject *)this);
      this_01 = RecyclableObject::GetScriptContext((RecyclableObject *)this_00);
      this_02 = ScriptContext::GetLibrary(this_01);
      pDVar8 = JavascriptLibraryBase::GetObjectPrototype(&this_02->super_JavascriptLibraryBase);
      if (pDVar8 == this_00) {
        pDVar8 = VarTo<Js::DynamicObject,Js::RecyclableObject>((RecyclableObject *)this_00);
        bVar2 = DynamicObject::HasNonEmptyObjectArray(pDVar8);
        if ((bVar2) &&
           (BVar4 = RecyclableObject::GetItem
                              ((RecyclableObject *)this_00,arr,indexInt,result,scriptContext),
           BVar4 != 0)) {
          arr_local._0_4_ = 1;
        }
        else {
          pRVar6 = ScriptContext::GetMissingItemResult(scriptContext);
          *result = pRVar6;
          arr_local._0_4_ = 1;
        }
      }
      else {
        arr_local._0_4_ = 0;
      }
    }
    else {
      arr_local._0_4_ = 1;
    }
  }
  else {
    arr_local._0_4_ = 0;
  }
  return (BOOL)arr_local;
}

Assistant:

BOOL JavascriptOperators::GetItemFromArrayPrototype(JavascriptArray * arr, int32 indexInt, Var * result, ScriptContext * scriptContext)
    {
        // try get from Array prototype
        RecyclableObject* prototype = arr->GetPrototype();
        if (JavascriptOperators::GetTypeId(prototype) != TypeIds_Array) //This can be TypeIds_ES5Array (or any other object changed through __proto__).
        {
            return false;
        }

        JavascriptArray* arrayPrototype = UnsafeVarTo<JavascriptArray>(prototype); //Prototype must be Array.prototype (unless changed through __proto__)
        if (arrayPrototype->GetLength() && arrayPrototype->GetItem(arrayPrototype, (uint32)indexInt, result, scriptContext))
        {
            return true;
        }

        prototype = arrayPrototype->GetPrototype(); //Its prototype must be Object.prototype (unless changed through __proto__)
        if (prototype->GetScriptContext()->GetLibrary()->GetObjectPrototype() != prototype)
        {
            return false;
        }

        if (VarTo<DynamicObject>(prototype)->HasNonEmptyObjectArray())
        {
            if (prototype->GetItem(arr, (uint32)indexInt, result, scriptContext))
            {
                return true;
            }
        }

        *result = scriptContext->GetMissingItemResult();
        return true;
    }